

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_txfm_utility_sse4.h
# Opt level: O0

__m128i half_btf_sse4_1(__m128i *w0,__m128i *n0,__m128i *w1,__m128i *n1,__m128i *rounding,int bit)

{
  __m128i alVar1;
  __m128i y;
  __m128i x;
  int bit_local;
  __m128i *rounding_local;
  __m128i *n1_local;
  __m128i *w1_local;
  __m128i *n0_local;
  __m128i *w0_local;
  
  pmulld((undefined1  [16])*w0,(undefined1  [16])*n0);
  pmulld((undefined1  [16])*w1,(undefined1  [16])*n1);
  alVar1[0] = (ulong)(uint)bit;
  alVar1[1] = (longlong)w1;
  return alVar1;
}

Assistant:

static inline __m128i half_btf_sse4_1(const __m128i *w0, const __m128i *n0,
                                      const __m128i *w1, const __m128i *n1,
                                      const __m128i *rounding, int bit) {
  __m128i x, y;

  x = _mm_mullo_epi32(*w0, *n0);
  y = _mm_mullo_epi32(*w1, *n1);
  x = _mm_add_epi32(x, y);
  x = _mm_add_epi32(x, *rounding);
  x = _mm_srai_epi32(x, bit);
  return x;
}